

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O2

BtorSimBitVector * btorsim_bv_redor(BtorSimBitVector *bv)

{
  BtorSimBitVector *bv_00;
  ulong uVar1;
  uint32_t bit;
  bool bVar2;
  
  bit = 1;
  bv_00 = btorsim_bv_new(1);
  uVar1 = 0;
  bVar2 = false;
  do {
    if (bVar2) {
LAB_001155a2:
      btorsim_bv_set_bit(bv_00,0,bit);
      return bv_00;
    }
    if (bv->len <= uVar1) {
      bit = 0;
      goto LAB_001155a2;
    }
    bVar2 = (&bv[1].width)[uVar1] != 0;
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

BtorSimBitVector *
btorsim_bv_redor (const BtorSimBitVector *bv)
{
  assert (bv);

  uint32_t i;
  uint32_t bit;
  BtorSimBitVector *res;

  res = btorsim_bv_new (1);
  assert (rem_bits_zero_dbg (res));
  bit = 0;
  for (i = 0; !bit && i < bv->len; i++)
    if (bv->bits[i]) bit = 1;

  btorsim_bv_set_bit (res, 0, bit);

  assert (rem_bits_zero_dbg (res));
  return res;
}